

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t bid_standard(archive_read *a)

{
  wchar_t wVar1;
  long local_28;
  char signature [8];
  uint8_t *p;
  archive_read *a_local;
  
  rar5_signature((char *)&local_28);
  wVar1 = read_ahead(a,8,(uint8_t **)signature);
  if (wVar1 == L'\0') {
    a_local._4_4_ = L'\xffffffff';
  }
  else if (local_28 == *(long *)signature) {
    a_local._4_4_ = L'\x1e';
  }
  else {
    a_local._4_4_ = L'\xffffffff';
  }
  return a_local._4_4_;
}

Assistant:

static int bid_standard(struct archive_read* a) {
	const uint8_t* p;
	char signature[sizeof(rar5_signature_xor)];

	rar5_signature(signature);

	if(!read_ahead(a, sizeof(rar5_signature_xor), &p))
		return -1;

	if(!memcmp(signature, p, sizeof(rar5_signature_xor)))
		return 30;

	return -1;
}